

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::write_decimal<unsigned__int128>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,unsigned___int128 value)

{
  undefined2 uVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong in_RDX;
  int iVar9;
  ulong in_RSI;
  undefined1 *puVar10;
  ulong uVar11;
  long lVar12;
  undefined1 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_168 [312];
  
  auVar15._8_8_ = in_RDX;
  auVar15._0_8_ = in_RSI;
  iVar9 = 1;
  if ((in_RSI < 10) <= in_RDX) {
    iVar5 = 4;
    auVar14 = auVar15;
    do {
      iVar9 = iVar5;
      uVar7 = auVar14._8_8_;
      uVar11 = auVar14._0_8_;
      if (uVar7 == 0 && (ulong)(99 < uVar11) <= -uVar7) {
        iVar9 = iVar9 + -2;
        goto LAB_001c5724;
      }
      if (uVar7 == 0 && (ulong)(999 < uVar11) <= -uVar7) {
        iVar9 = iVar9 + -1;
        goto LAB_001c5724;
      }
      if (uVar7 < (uVar11 < 10000)) goto LAB_001c5724;
      auVar14 = __udivti3(uVar11,uVar7,10000,0);
      iVar5 = iVar9 + 4;
    } while (uVar7 != 0 || -uVar7 < (ulong)(99999 < uVar11));
    iVar9 = iVar9 + 1;
  }
LAB_001c5724:
  lVar12 = (long)iVar9;
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  uVar7 = lVar3 + lVar12;
  if ((ulong)puVar2[3] < uVar7) {
    (**(code **)*puVar2)(puVar2,uVar7);
  }
  puVar2[2] = uVar7;
  lVar4 = puVar2[1];
  puVar10 = local_168 + lVar12 * 4;
  if ((in_RSI < 100) <= in_RDX) {
    do {
      lVar8 = auVar15._8_8_;
      uVar7 = auVar15._0_8_;
      auVar15 = __udivti3(uVar7,lVar8,100,0);
      uVar1 = *(undefined2 *)(basic_data<void>::digits + (uVar7 + auVar15._0_8_ * -100) * 2);
      uVar13 = (undefined1)((ushort)uVar1 >> 8);
      auVar14 = ZEXT416(CONCAT22((short)(CONCAT13(uVar13,CONCAT12(uVar13,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar14 = pshuflw(auVar14,auVar14,0x60);
      *(ulong *)(puVar10 + -8) = CONCAT44(auVar14._4_4_ >> 0x18,auVar14._0_4_ >> 0x18);
      puVar10 = puVar10 + -8;
    } while (lVar8 != 0 || (ulong)-lVar8 < (ulong)(9999 < uVar7));
  }
  if (auVar15._8_8_ == 0 && (ulong)(9 < auVar15._0_8_) <= (ulong)-auVar15._8_8_) {
    uVar6 = auVar15._0_4_ | 0x30;
    lVar8 = -4;
  }
  else {
    uVar7 = auVar15._0_8_ & 0xffffffff;
    *(int *)(puVar10 + -4) = (int)(char)basic_data<void>::digits[(uVar7 * 2 & 0xffffffff) + 1];
    uVar6 = (uint)(char)basic_data<void>::digits[uVar7 * 2];
    lVar8 = -8;
  }
  *(uint *)(puVar10 + lVar8) = uVar6;
  memcpy((void *)(lVar4 + lVar3 * 4),local_168,lVar12 << 2);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }